

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerate.cpp
# Opt level: O1

void __thiscall
luna::CodeGenerateVisitor::Visit(CodeGenerateVisitor *this,BreakStatement *break_stmt,void *data)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  GenerateFunction *pGVar3;
  size_t sVar4;
  _List_node_base *p_Var5;
  
  if (break_stmt->loop_ != (SyntaxTree *)0x0) {
    sVar4 = Function::AddInstruction
                      (this->current_function_->function_,(Instruction)0x12000000,
                       (break_stmt->break_).line_);
    p_Var2 = (_List_node_base *)break_stmt->loop_;
    pGVar3 = this->current_function_;
    p_Var5 = (_List_node_base *)operator_new(0x20);
    p_Var5[1]._M_next = p_Var2;
    *(undefined4 *)&p_Var5[1]._M_prev = 1;
    *(int *)((long)&p_Var5[1]._M_prev + 4) = (int)sVar4;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar1 = &(pGVar3->loop_jumps_).
              super__List_base<luna::LoopJumpInfo,_std::allocator<luna::LoopJumpInfo>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("break_stmt->loop_",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/CodeGenerate.cpp"
                ,0x31b,"virtual void luna::CodeGenerateVisitor::Visit(BreakStatement *, void *)");
}

Assistant:

void CodeGenerateVisitor::Visit(BreakStatement *break_stmt, void *data)
    {
        assert(break_stmt->loop_);
        auto function = GetCurrentFunction();
        auto instruction = Instruction::AsBxCode(OpType_Jmp, 0, 0);
        int index = function->AddInstruction(instruction, break_stmt->break_.line_);
        AddLoopJumpInfo(break_stmt->loop_, index, LoopJumpInfo::JumpTail);
    }